

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
             *this)

{
  DatarateTest *this_00;
  ParamType *ppAVar1;
  
  WithParamInterface<libaom_test::AV1CodecFactory_const*>::parameter_ = &this->parameter_;
  this_00 = (DatarateTest *)operator_new(0x4e0);
  ppAVar1 = WithParamInterface<const_libaom_test::AV1CodecFactory_*>::GetParam();
  datarate_test::anon_unknown_0::DatarateTest::DatarateTest(this_00,&(*ppAVar1)->super_CodecFactory)
  ;
  TestWithParam<const_libaom_test::AV1CodecFactory_*>::TestWithParam
            ((TestWithParam<const_libaom_test::AV1CodecFactory_*> *)(this_00 + 1));
  this_00[1].super_EncoderTest.cfg_.g_profile = 0;
  this_00[1].super_EncoderTest.cfg_.g_w = 0xbaba;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__DatarateTestSetFrameQpRealtime_00f1f330;
  this_00[1].super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test_00f1f3f0;
  *(undefined ***)&this_00[1].super_EncoderTest.abort_ =
       &PTR__DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test_00f1f430;
  return (Test *)(this_00 + 1);
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }